

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_smf_midiout.cpp
# Opt level: O3

DWORD * __thiscall
MIDISong2::SendCommand
          (MIDISong2 *this,DWORD *events,TrackInfo *track,DWORD delay,ptrdiff_t room,
          bool *sysex_noroom)

{
  byte *pbVar1;
  BYTE BVar2;
  char cVar3;
  ulong uVar4;
  TrackInfo *pTVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  BYTE *pBVar12;
  long lVar13;
  uint uVar14;
  size_t sVar15;
  undefined1 uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  DWORD *__dest;
  
  *sysex_noroom = false;
  uVar18 = track->TrackP;
  uVar4 = track->MaxTrackP;
  if (uVar4 <= uVar18) goto LAB_0033b5fc;
  pBVar12 = track->TrackBegin;
  uVar17 = uVar18 + 1;
  track->TrackP = uVar17;
  if (uVar4 <= uVar17) goto LAB_0033b5fc;
  bVar6 = pBVar12[uVar18];
  uVar19 = (uint)bVar6;
  uVar7 = (uint)bVar6;
  *events = delay;
  events[1] = 0;
  events[2] = 0x2000000;
  if ((bVar6 - 0xf0 < 0x10) && ((0x8081U >> (bVar6 - 0xf0 & 0x1f) & 1) != 0)) {
    if (bVar6 != 0xf0) {
      if (bVar6 == 0xff) {
        uVar17 = uVar18 + 2;
        track->TrackP = uVar17;
        if (uVar4 <= uVar17) goto LAB_0033b5fc;
        BVar2 = pBVar12[uVar18 + 1];
        pBVar12 = track->TrackBegin;
        uVar19 = 0;
        do {
          sVar15 = uVar17;
          if (uVar4 <= uVar17) break;
          sVar15 = uVar17 + 1;
          track->TrackP = sVar15;
          pbVar1 = pBVar12 + uVar17;
          uVar19 = uVar19 << 7 | *pbVar1 & 0x7f;
          uVar17 = sVar15;
        } while ((char)*pbVar1 < '\0');
        if (uVar4 <= sVar15) goto LAB_0033b5fc;
        uVar18 = uVar19 + sVar15;
        if (uVar18 <= uVar4) {
          if (BVar2 == 'Q') {
            (this->super_MIDIStreamer).Tempo =
                 (uint)pBVar12[sVar15 + 2] |
                 (uint)pBVar12[sVar15 + 1] << 8 | (uint)pBVar12[sVar15] << 0x10;
            *events = delay;
            events[1] = 0;
            events[2] = (this->super_MIDIStreamer).Tempo | 0x1000000;
          }
          else if (BVar2 == '/') {
            track->Finished = true;
          }
          track->TrackP = uVar18;
          if (uVar18 != uVar4) goto LAB_0033b6bc;
        }
LAB_0033b6b7:
        track->Finished = true;
        goto LAB_0033b6bc;
      }
      if (uVar7 != 0xf7) goto LAB_0033b6bc;
    }
    pBVar12 = track->TrackBegin;
    uVar19 = 0;
    do {
      sVar15 = uVar17;
      if (uVar4 <= uVar17) break;
      sVar15 = uVar17 + 1;
      track->TrackP = sVar15;
      pbVar1 = pBVar12 + uVar17;
      uVar19 = uVar19 << 7 | *pbVar1 & 0x7f;
      uVar17 = sVar15;
    } while ((char)*pbVar1 < '\0');
    if ((uVar19 < 0x5f4) && ((this->super_MIDIStreamer).DeviceType != MDEV_SNDSYS)) {
      if ((ulong)(room * 4) <= (ulong)(uVar19 + 0xc)) {
        track->TrackP = uVar18;
        *sysex_noroom = true;
        return events;
      }
      if (bVar6 == 0xf0) {
        uVar7 = uVar19 + 0x80000001;
        __dest = (DWORD *)((long)events + 0xd);
        *(undefined1 *)(events + 3) = 0xf0;
        pBVar12 = track->TrackBegin;
        sVar15 = track->TrackP;
      }
      else {
        __dest = events + 3;
        uVar7 = uVar19 | 0x80000000;
      }
      events[2] = uVar7;
      uVar18 = (ulong)uVar19;
      memcpy(__dest,pBVar12 + sVar15,uVar18);
      if (((long)__dest + uVar18 & 3) != 0) {
        memset((void *)((long)__dest + uVar18),0,(ulong)(~uVar19 - (int)__dest & 3) + 1);
      }
      track->TrackP = track->TrackP + uVar18;
    }
    else {
      track->TrackP = sVar15 + uVar19;
    }
    goto LAB_0033b6bc;
  }
  uVar20 = (uint)bVar6;
  if ((~uVar7 & 0xf0) == 0) {
    if (MIDI_CommonLengths[uVar7 & 0xf] < '\x01') {
      uVar19 = 0;
      uVar7 = 0;
    }
    else {
      track->TrackP = uVar18 + 2;
      uVar19 = (uint)pBVar12[uVar18 + 1];
      if (MIDI_CommonLengths[uVar7 & 0xf] < '\x02') goto LAB_0033b56e;
      uVar17 = uVar18 + 3;
      track->TrackP = uVar17;
      uVar7 = (uint)pBVar12[uVar18 + 2];
    }
  }
  else if ((char)bVar6 < '\0') {
    track->RunningStatus = bVar6;
    track->TrackP = uVar18 + 2;
    uVar19 = (uint)pBVar12[uVar18 + 1];
LAB_0033b56e:
    uVar17 = uVar18 + 2;
    uVar7 = 0;
  }
  else {
    uVar20 = (uint)track->RunningStatus;
    uVar7 = 0;
  }
  if (uVar4 <= uVar17) {
LAB_0033b5fc:
    track->Finished = true;
    return events;
  }
  uVar14 = uVar20 & 0x70;
  if (MIDI_EventLengths[uVar14 >> 4] == '\x02') {
    track->TrackP = uVar17 + 1;
    uVar7 = (uint)pBVar12[uVar17];
  }
  if (uVar14 != 0x30) {
    if (uVar14 == 0x40) {
      cVar3 = track->EProgramChange;
joined_r0x0033b5b5:
      if (cVar3 != '\0') goto LAB_0033b6bc;
    }
    goto switchD_0033b62c_caseD_72;
  }
  bVar6 = (byte)uVar7;
  switch(uVar19) {
  case 0x6e:
    uVar19 = 0x6e;
    if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
      if (bVar6 == 0x7f) {
        track->Designation = 0xffff;
      }
      else {
        if (9 < bVar6) goto LAB_0033b6bc;
        track->Designation = track->Designation | (ushort)(1 << (bVar6 & 0x1f));
      }
      track->Designated = true;
      goto LAB_0033b6bc;
    }
    break;
  case 0x6f:
    uVar19 = 0x6f;
    if (track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) {
      if ((track->Designated == true) && (bVar6 < 10)) {
        track->Designation =
             track->Designation &
             ((ushort)(-2 << (bVar6 & 0x1f)) | (ushort)(0xfffffffe >> 0x20 - (bVar6 & 0x1f)));
      }
      goto LAB_0033b6bc;
    }
    break;
  case 0x70:
    if (((uint)(this->super_MIDIStreamer).Division <= track->PlayedTime) &&
       (uVar19 = 0x70, track->EProgramChange != true)) break;
    track->EProgramChange = true;
    uVar20 = (uint)((byte)uVar20 & 0xf | 0xc0);
    uVar14 = 0;
    goto LAB_0033b5c9;
  case 0x71:
    if ((track->PlayedTime < (uint)(this->super_MIDIStreamer).Division) ||
       (uVar19 = 0x71, track->EVolume == true)) {
      track->EVolume = true;
LAB_0033b925:
      uVar7 = MIDIStreamer::VolumeControllerChange(&this->super_MIDIStreamer,uVar20 & 0xf,uVar7);
      uVar19 = 7;
    }
    break;
  case 0x72:
  case 0x73:
    break;
  case 0x74:
    iVar8 = uVar7 + 1;
    if (bVar6 == 0) {
      iVar8 = 0;
    }
    iVar8 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,iVar8);
    if (iVar8 != 1) {
      track->LoopBegin = track->TrackP;
      iVar10 = iVar8 + -1;
      if (iVar8 == 0) {
        iVar10 = 0;
      }
      track->LoopDelay = 0;
      track->LoopCount = iVar10;
      track->LoopFinished = track->Finished;
    }
    goto LAB_0033b6bc;
  case 0x75:
    iVar8 = track->LoopCount;
    if ((iVar8 < 0) || (bVar6 != 0x7f)) goto LAB_0033b6bc;
    if (iVar8 == 0) {
      if ((this->super_MIDIStreamer).super_MusInfo.m_Looping == false) goto LAB_0033b6b7;
    }
    else {
      track->LoopCount = -(uint)(iVar8 - 1U == 0) | iVar8 - 1U;
    }
    track->TrackP = track->LoopBegin;
    track->Delay = track->LoopDelay;
    track->Finished = track->LoopFinished;
    goto LAB_0033b6bc;
  case 0x76:
    iVar8 = 0;
    if (bVar6 != 0) {
      iVar8 = uVar7 + 1;
    }
    iVar8 = MIDIStreamer::ClampLoopCount(&this->super_MIDIStreamer,iVar8);
    if ((iVar8 != 1) && (iVar10 = this->NumTracks, 0 < (long)iVar10)) {
      pTVar5 = this->Tracks;
      lVar11 = 0;
      iVar9 = iVar8 + -1;
      if (iVar8 == 0) {
        iVar9 = 0;
      }
      do {
        *(undefined8 *)((long)&pTVar5->LoopBegin + lVar11) =
             *(undefined8 *)((long)&pTVar5->TrackP + lVar11);
        *(undefined4 *)((long)&pTVar5->LoopDelay + lVar11) =
             *(undefined4 *)((long)&pTVar5->Delay + lVar11);
        *(int *)((long)&pTVar5->LoopCount + lVar11) = iVar9;
        (&pTVar5->LoopFinished)[lVar11] = (&pTVar5->Finished)[lVar11];
        lVar11 = lVar11 + 0x40;
      } while ((long)iVar10 * 0x40 != lVar11);
    }
    goto LAB_0033b6bc;
  case 0x77:
    if ((bVar6 == 0x7f) && (iVar8 = this->NumTracks, 0 < iVar8)) {
      lVar11 = 0x38;
      lVar13 = 0;
      do {
        pTVar5 = this->Tracks;
        iVar10 = *(int *)((long)pTVar5 + lVar11 + -4);
        if (-1 < iVar10) {
          if (iVar10 == 0) {
            uVar16 = 1;
            if ((this->super_MIDIStreamer).super_MusInfo.m_Looping != false) goto LAB_0033b82c;
          }
          else {
            *(uint *)((long)pTVar5 + lVar11 + -4) = -(uint)(iVar10 - 1U == 0) | iVar10 - 1U;
            iVar8 = this->NumTracks;
LAB_0033b82c:
            *(undefined8 *)((long)pTVar5 + lVar11 + -0x30) =
                 *(undefined8 *)((long)pTVar5 + lVar11 + -0x10);
            *(undefined4 *)((long)pTVar5 + lVar11 + -0x20) =
                 *(undefined4 *)((long)pTVar5 + lVar11 + -8);
            uVar16 = *(undefined1 *)((long)&pTVar5->TrackBegin + lVar11);
          }
          *(undefined1 *)((long)pTVar5 + lVar11 + -0x18) = uVar16;
        }
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 0x40;
      } while (lVar13 < iVar8);
    }
    goto LAB_0033b6bc;
  default:
    if (uVar19 == 0x27) {
      uVar19 = 0x27;
      cVar3 = track->EVolume;
      goto joined_r0x0033b5b5;
    }
    if (uVar19 == 7) {
      if (track->EVolume != false) goto LAB_0033b6bc;
      goto LAB_0033b925;
    }
  }
switchD_0033b62c_caseD_72:
  uVar14 = uVar7;
  uVar7 = uVar19;
  if ((byte)uVar20 != 0xff) {
LAB_0033b5c9:
    if ((track->Designated != true) || ((track->Designation & this->DesignationMask) != 0)) {
      events[2] = (uVar14 & 0xff) << 0x10 | uVar7 << 8 | uVar20;
    }
  }
LAB_0033b6bc:
  if (track->Finished == false) {
    uVar19 = 0;
    sVar15 = track->TrackP;
    do {
      if (track->MaxTrackP <= sVar15) break;
      track->TrackP = sVar15 + 1;
      pbVar1 = track->TrackBegin + sVar15;
      uVar19 = uVar19 << 7 | *pbVar1 & 0x7f;
      sVar15 = sVar15 + 1;
    } while ((char)*pbVar1 < '\0');
    track->Delay = uVar19;
  }
  if ((events[2] & 0xff000000) != 0x2000000 || *events != 0) {
    events = events + 3;
  }
  return events;
}

Assistant:

DWORD *MIDISong2::SendCommand (DWORD *events, TrackInfo *track, DWORD delay, ptrdiff_t room, bool &sysex_noroom)
{
	DWORD len;
	BYTE event, data1 = 0, data2 = 0;
	int i;

	sysex_noroom = false;
	size_t start_p = track->TrackP;

	CHECK_FINISHED
	event = track->TrackBegin[track->TrackP++];
	CHECK_FINISHED

	// The actual event type will be filled in below.
	events[0] = delay;
	events[1] = 0;
	events[2] = MEVT_NOP << 24;

	if (event != MIDI_SYSEX && event != MIDI_META && event != MIDI_SYSEXEND)
	{
		// Normal short message
		if ((event & 0xF0) == 0xF0)
		{
			if (MIDI_CommonLengths[event & 15] > 0)
			{
				data1 = track->TrackBegin[track->TrackP++];
				if (MIDI_CommonLengths[event & 15] > 1)
				{
					data2 = track->TrackBegin[track->TrackP++];
				}
			}
		}
		else if ((event & 0x80) == 0)
		{
			data1 = event;
			event = track->RunningStatus;
		}
		else
		{
			track->RunningStatus = event;
			data1 = track->TrackBegin[track->TrackP++];
		}

		CHECK_FINISHED

		if (MIDI_EventLengths[(event&0x70)>>4] == 2)
		{
			data2 = track->TrackBegin[track->TrackP++];
		}

		switch (event & 0x70)
		{
		case MIDI_PRGMCHANGE & 0x70:
			if (track->EProgramChange)
			{
				event = MIDI_META;
			}
			break;

		case MIDI_CTRLCHANGE & 0x70:
			switch (data1)
			{
			case 7:		// Channel volume
				if (track->EVolume)
				{ // Tracks that use EMIDI volume ignore normal volume changes.
					event = MIDI_META;
				}
				else
				{
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 7+32:	// Channel volume (LSB)
				if (track->EVolume)
				{
					event = MIDI_META;
				}
				// It should be safe to pass this straight through to the
				// MIDI device, since it's a very fine amount.
				break;

			case 110:	// EMIDI Track Designation - InitBeat only
				// Instruments 4, 5, 6, and 7 are all FM synth.
				// The rest are all wavetable.
				if (track->PlayedTime < (DWORD)Division)
				{
					if (data2 == 127)
					{
						track->Designation = ~0;
						track->Designated = true;
					}
					else if (data2 <= 9)
					{
						track->Designation |= 1 << data2;
						track->Designated = true;
					}
					event = MIDI_META;
				}
				break;

			case 111:	// EMIDI Track Exclusion - InitBeat only
				if (track->PlayedTime < (DWORD)Division)
				{
					if (track->Designated && data2 <= 9)
					{
						track->Designation &= ~(1 << data2);
					}
					event = MIDI_META;
				}
				break;

			case 112:	// EMIDI Program Change
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EProgramChange)
				{
					track->EProgramChange = true;
					event = 0xC0 | (event & 0x0F);
					data1 = data2;
					data2 = 0;
				}
				break;

			case 113:	// EMIDI Volume
				// Ignored unless it also appears in the InitBeat
				if (track->PlayedTime < (DWORD)Division || track->EVolume)
				{
					track->EVolume = true;
					data1 = 7;
					data2 = VolumeControllerChange(event & 15, data2);
				}
				break;

			case 116:	// EMIDI Loop Begin
				{
					// We convert the loop count to XMIDI conventions before clamping.
					// Then we convert it back to EMIDI conventions after clamping.
					// (XMIDI can create "loops" that don't loop. EMIDI cannot.)
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						track->LoopBegin = track->TrackP;
						track->LoopDelay = 0;
						track->LoopCount = loopcount == 0 ? 0 : loopcount - 1;
						track->LoopFinished = track->Finished;
					}
				}
				event = MIDI_META;
				break;

			case 117:	// EMIDI Loop End
				if (track->LoopCount >= 0 && data2 == 127)
				{
					if (track->LoopCount == 0 && !m_Looping)
					{
						track->Finished = true;
					}
					else
					{
						if (track->LoopCount > 0 && --track->LoopCount == 0)
						{
							track->LoopCount = -1;
						}
						track->TrackP = track->LoopBegin;
						track->Delay = track->LoopDelay;
						track->Finished = track->LoopFinished;
					}
				}
				event = MIDI_META;
				break;

			case 118:	// EMIDI Global Loop Begin
				{
					int loopcount = ClampLoopCount(data2 == 0 ? 0 : data2 + 1);
					if (loopcount != 1)
					{
						for (i = 0; i < NumTracks; ++i)
						{
							Tracks[i].LoopBegin = Tracks[i].TrackP;
							Tracks[i].LoopDelay = Tracks[i].Delay;
							Tracks[i].LoopCount = loopcount == 0 ? 0 : loopcount - 1;
							Tracks[i].LoopFinished = Tracks[i].Finished;
						}
					}
				}
				event = MIDI_META;
				break;

			case 119:	// EMIDI Global Loop End
				if (data2 == 127)
				{
					for (i = 0; i < NumTracks; ++i)
					{
						if (Tracks[i].LoopCount >= 0)
						{
							if (Tracks[i].LoopCount == 0 && !m_Looping)
							{
								Tracks[i].Finished = true;
							}
							else
							{
								if (Tracks[i].LoopCount > 0 && --Tracks[i].LoopCount == 0)
								{
									Tracks[i].LoopCount = -1;
								}
								Tracks[i].TrackP = Tracks[i].LoopBegin;
								Tracks[i].Delay = Tracks[i].LoopDelay;
								Tracks[i].Finished = Tracks[i].LoopFinished;
							}
						}
					}
				}
				event = MIDI_META;
				break;
			}
		}
		if (event != MIDI_META && (!track->Designated || (track->Designation & DesignationMask)))
		{
			events[2] = event | (data1<<8) | (data2<<16);
		}
	}
	else
	{
		// SysEx events could potentially not have enough room in the buffer...
		if (event == MIDI_SYSEX || event == MIDI_SYSEXEND)
		{
			len = track->ReadVarLen();
			if (len >= (MAX_EVENTS-1)*3*4 || DeviceType == MDEV_SNDSYS)
			{ // This message will never fit. Throw it away.
				track->TrackP += len;
			}
			else if (len + 12 >= (size_t)room * 4)
			{ // Not enough room left in this buffer. Backup and wait for the next one.
				track->TrackP = start_p;
				sysex_noroom = true;
				return events;
			}
			else
			{
				BYTE *msg = (BYTE *)&events[3];
				if (event == MIDI_SYSEX)
				{ // Need to add the SysEx marker to the message.
					events[2] = (MEVT_LONGMSG << 24) | (len + 1);
					*msg++ = MIDI_SYSEX;
				}
				else
				{
					events[2] = (MEVT_LONGMSG << 24) | len;
				}
				memcpy(msg, &track->TrackBegin[track->TrackP], len);
				msg += len;
				// Must pad with 0
				while ((size_t)msg & 3)
				{
					*msg++ = 0;
				}
				track->TrackP += len;
			}
		}
		else if (event == MIDI_META)
		{
			// It's a meta-event
			event = track->TrackBegin[track->TrackP++];
			CHECK_FINISHED
			len = track->ReadVarLen ();
			CHECK_FINISHED

			if (track->TrackP + len <= track->MaxTrackP)
			{
				switch (event)
				{
				case MIDI_META_EOT:
					track->Finished = true;
					break;

				case MIDI_META_TEMPO:
					Tempo =
						(track->TrackBegin[track->TrackP+0]<<16) |
						(track->TrackBegin[track->TrackP+1]<<8)  |
						(track->TrackBegin[track->TrackP+2]);
					events[0] = delay;
					events[1] = 0;
					events[2] = (MEVT_TEMPO << 24) | Tempo;
					break;
				}
				track->TrackP += len;
				if (track->TrackP == track->MaxTrackP)
				{
					track->Finished = true;
				}
			}
			else
			{
				track->Finished = true;
			}
		}
	}